

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O2

void __thiscall
Txid_TxidEqualsGetByte_Test::~Txid_TxidEqualsGetByte_Test(Txid_TxidEqualsGetByte_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Txid, TxidEqualsGetByte) {
  std::vector<uint8_t> list1(32);
  list1[2] = 8;
  list1[4] = 64;
  list1[6] = 32;
  ByteData256 byte_data = ByteData256(list1);
  Txid txid = Txid(byte_data);
  bool is_equals = (txid.GetData().GetBytes() == list1);
  EXPECT_TRUE(is_equals);
}